

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

int Gia_ObjCheckTfi_rec(Gia_Man_t *p,Gia_Obj_t *pOld,Gia_Obj_t *pNode,Vec_Ptr_t *vVisited)

{
  int iVar1;
  void **ppvVar2;
  uint uVar3;
  
  do {
    if (pNode == (Gia_Obj_t *)0x0) {
      return 0;
    }
    uVar3 = (uint)*(ulong *)pNode;
    if ((~uVar3 & 0x9fffffff) == 0) {
      return 0;
    }
    if (pNode == pOld) {
      return 1;
    }
    if ((uVar3 >> 0x1e & 1) != 0) {
      return 0;
    }
    *(ulong *)pNode = *(ulong *)pNode | 0x40000000;
    uVar3 = vVisited->nCap;
    if (vVisited->nSize == uVar3) {
      if ((int)uVar3 < 0x10) {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar2 = (void **)malloc(0x80);
        }
        else {
          ppvVar2 = (void **)realloc(vVisited->pArray,0x80);
        }
        vVisited->pArray = ppvVar2;
        iVar1 = 0x10;
      }
      else {
        iVar1 = uVar3 * 2;
        if (iVar1 <= (int)uVar3) goto LAB_00202e6b;
        if (vVisited->pArray == (void **)0x0) {
          ppvVar2 = (void **)malloc((ulong)uVar3 << 4);
        }
        else {
          ppvVar2 = (void **)realloc(vVisited->pArray,(ulong)uVar3 << 4);
        }
        vVisited->pArray = ppvVar2;
      }
      vVisited->nCap = iVar1;
    }
LAB_00202e6b:
    iVar1 = vVisited->nSize;
    vVisited->nSize = iVar1 + 1;
    vVisited->pArray[iVar1] = pNode;
    iVar1 = Gia_ObjCheckTfi_rec(p,pOld,pNode + -(ulong)((uint)*(undefined8 *)pNode & 0x1fffffff),
                                vVisited);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = Gia_ObjCheckTfi_rec(p,pOld,pNode + -(ulong)(*(uint *)&pNode->field_0x4 & 0x1fffffff),
                                vVisited);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = Gia_ObjId(p,pNode);
    pNode = Gia_ObjNextObj(p,iVar1);
  } while( true );
}

Assistant:

int Gia_ObjCheckTfi_rec( Gia_Man_t * p, Gia_Obj_t * pOld, Gia_Obj_t * pNode, Vec_Ptr_t * vVisited )
{
    // check the trivial cases
    if ( pNode == NULL )
        return 0;
    if ( Gia_ObjIsCi(pNode) )
        return 0;
//    if ( pNode->Id < pOld->Id ) // cannot use because of choices of pNode
//        return 0;
    if ( pNode == pOld )
        return 1;
    // skip the visited node
    if ( pNode->fMark0 )
        return 0;
    pNode->fMark0 = 1;
    Vec_PtrPush( vVisited, pNode );
    // check the children
    if ( Gia_ObjCheckTfi_rec( p, pOld, Gia_ObjFanin0(pNode), vVisited ) )
        return 1;
    if ( Gia_ObjCheckTfi_rec( p, pOld, Gia_ObjFanin1(pNode), vVisited ) )
        return 1;
    // check equivalent nodes
    return Gia_ObjCheckTfi_rec( p, pOld, Gia_ObjNextObj(p, Gia_ObjId(p, pNode)), vVisited );
}